

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpMap<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  ushort *puVar8;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  LogMessageData *node;
  ushort *puVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  Nonnull<const_char_*> failure_msg;
  char *pcVar16;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar17;
  long lVar18;
  uint7 uVar19;
  int iVar20;
  undefined8 extraout_RDX;
  LogMessageData *extraout_RDX_00;
  LogMessageData *extraout_RDX_01;
  LogMessageData *pLVar21;
  LogMessageData *extraout_RDX_02;
  LogMessageData *extraout_RDX_03;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> hasbits_00;
  LogMessageData *pLVar22;
  LogMessageData *ptr_00;
  LogMessageData *table_00;
  HiRep HVar23;
  MapFieldBaseForParse *target;
  HiRep HVar24;
  LogMessageData *this;
  pair<const_char_*,_int> pVar25;
  FieldAux *aux;
  LogMessageData *pLVar26;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_88;
  undefined1 local_80 [32];
  LogMessageData *local_60;
  HiRep local_58;
  HiRep local_50;
  LogMessageData *local_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *local_40;
  LogMessageData *local_38;
  
  HVar24 = (HiRep)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)HVar24 & 3) != 0) {
    AlignFail(HVar24);
  }
  local_88.data =
       (long)&table->has_bits_offset +
       (ulong)*(uint16_t *)((long)HVar24 + 8) * 8 + (ulong)table->aux_offset;
  bVar1 = *(byte *)(local_88.data + 4);
  if (((bVar1 & 1) == 0) || (uVar10 = data.field_0._0_4_, (uVar10 & 7) != 2)) {
    pcVar16 = MpFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar16;
  }
  uVar5 = *(undefined4 *)
           ((long)&table->has_bits_offset +
           (ulong)*(uint16_t *)((long)HVar24 + 8) * 8 + (ulong)table->aux_offset);
  table_00 = (LogMessageData *)table;
  HVar23 = (HiRep)hasbits;
  pvVar11 = MaybeGetSplitBase(msg,true,table);
  this = (LogMessageData *)((ulong)*(uint *)HVar24 + (long)pvVar11);
  local_50 = HVar24;
  if ((bVar1 & 2) == 0) {
    if (((ulong)this & 7) != 0) {
LAB_00fc5e52:
      AlignFail(this);
    }
    if (((ulong)(this->entry).full_filename_._M_len & 1) != 0) {
      (*MapFieldBaseForParse::sync_map_with_repeated)(this,1);
    }
    this = (LogMessageData *)&(this->entry).base_filename_;
  }
  else if (((ulong)this & 7) != 0) goto LAB_00fc5e52;
  local_58.hi_._0_1_ = bVar1;
  local_58.lo_ = uVar5;
  local_58.hi_._1_3_ = 0;
  do {
    ptr_00 = (LogMessageData *)(ulong)*(ushort *)((long)&(this->entry).full_filename_._M_str + 4);
    node = (LogMessageData *)UntypedMapBase::AllocNode((UntypedMapBase *)this,(size_t)ptr_00);
    uVar15 = (ulong)*(ushort *)((long)&(this->entry).full_filename_._M_str + 4);
    uVar14 = uVar15 - 8;
    if (uVar14 < 8) {
      ptr_00 = (LogMessageData *)&DAT_00000008;
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                              (uVar14,8,
                               "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    }
    else {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    if (failure_msg != (Nonnull<const_char_*>)0x0) {
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      iVar20 = 0xb2c;
LAB_00fc5ea2:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,pcVar16,iVar20,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_80);
    }
    (node->entry).full_filename_._M_str = (char *)0x0;
    *(undefined8 *)((long)node + (uVar15 - 8)) = 0;
    hasbits_00._M_head_impl = (LogMessageData *)&local_48;
    f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
           *)hasbits_00._M_head_impl;
    f.this = (UntypedMapBase *)this;
    f.node = (NodeBase **)&local_60;
    local_80._0_8_ = this;
    local_80._8_8_ = hasbits_00._M_head_impl;
    local_80._16_8_ = &local_60;
    local_60 = node;
    local_48 = this;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)this,f);
    local_40 = &local_88;
    f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)hasbits_00._M_head_impl;
    f_00.this = (UntypedMapBase *)this;
    f_00.node = (NodeBase **)&local_60;
    pLVar21 = this;
    pLVar26 = this;
    local_80._0_8_ = this;
    local_80._8_8_ = hasbits_00._M_head_impl;
    local_80._16_8_ = &local_60;
    local_60 = node;
    local_48 = this;
    local_38 = this;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)this,f_00);
    bVar2 = *(byte *)&(((LogMessageData *)ptr)->entry).full_filename_._M_len;
    aVar17.data._1_7_ = 0;
    aVar17.data._0_1_ = bVar2;
    if ((char)bVar2 < '\0') {
      ptr_00 = (LogMessageData *)(ulong)(uint)bVar2;
      pVar25 = ReadSizeFallback(ptr,(uint)bVar2);
      aVar17.data = pVar25._8_8_ & 0xffffffff;
    }
    else {
      pVar25._8_8_ = extraout_RDX;
      pVar25.first = (char *)((long)&(((LogMessageData *)ptr)->entry).full_filename_._M_len + 1);
      ptr = (char *)pLVar21;
    }
    pLVar21 = pVar25._8_8_;
    pLVar22 = (LogMessageData *)pVar25.first;
    if ((pLVar22 == (LogMessageData *)0x0) || (ctx->depth_ < 1)) {
      pLVar22 = (LogMessageData *)0x0;
    }
    else {
      ptr = local_80;
      ptr_00 = (LogMessageData *)ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)ptr,(char *)ctx,(int)pVar25.first);
      local_80._28_4_ = local_80._0_4_;
      ctx->depth_ = ctx->depth_ + -1;
      pLVar21 = extraout_RDX_00;
    }
    if (pLVar22 == (LogMessageData *)0x0) {
LAB_00fc5b55:
      puVar12 = (ushort *)0x0;
    }
    else {
      iVar20 = ctx->depth_;
      hasbits_00._M_head_impl = (LogMessageData *)(long)iVar20;
      aVar17 = local_88;
      ptr = (char *)node;
      table_00 = (LogMessageData *)table;
      HVar23 = local_50;
      pLVar26 = this;
      puVar12 = (ushort *)
                ParseOneMapEntry((NodeBase *)node,(char *)pLVar22,ctx,(FieldAux *)local_88,table,
                                 (FieldEntry *)local_50,(UntypedMapBase *)this);
      pLVar21 = extraout_RDX_01;
      if (puVar12 != (ushort *)0x0) {
        pLVar22 = (LogMessageData *)(long)ctx->depth_;
        if (iVar20 == ctx->depth_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          ptr = (char *)hasbits_00._M_head_impl;
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  ((long)hasbits_00._M_head_impl,(long)pLVar22,"old_depth == depth_"
                                  );
          pLVar21 = extraout_RDX_02;
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          pcVar16 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          iVar20 = 0x481;
          goto LAB_00fc5ea2;
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      uVar9 = (ctx->super_EpsCopyInputStream).limit_ + local_80._28_4_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar9;
      ptr_00 = pLVar22;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_00fc5b55;
      aVar17._0_4_ = (int)uVar9 >> 0x1f & uVar9;
      aVar17.data._4_4_ = 0;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar17._0_4_;
    }
    if (puVar12 == (ushort *)0x0) {
      if ((this->entry).base_filename_._M_str == (char *)0x0) {
        UntypedMapBase::DeleteNode((UntypedMapBase *)this,(NodeBase *)node);
        pLVar21 = extraout_RDX_03;
        ptr_00 = node;
      }
      pcVar16 = Error(msg,(char *)ptr_00,(ParseContext *)pLVar21,(TcFieldData)aVar17,table,hasbits);
      return pcVar16;
    }
    if ((bVar1 & 0x10) == 0) {
LAB_00fc5b99:
      uVar9 = *(uint *)((long)&(this->entry).full_filename_._M_str + 4);
      if (5 < ((byte)(uVar9 >> 0x18) & 0xf)) {
switchD_00fc5bbf_caseD_3:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb68);
      }
      uVar9 = uVar9 >> 0x18 & 0xf;
      puVar13 = &switchD_00fc5bbf::switchdataD_014339d4;
      uVar14 = (ulong)(int)(&switchD_00fc5bbf::switchdataD_014339d4)[uVar9];
      uVar15 = (long)&switchD_00fc5bbf::switchdataD_014339d4 + uVar14;
      switch(uVar9) {
      case 0:
switchD_00fc5bbf_caseD_0:
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)this,(KeyNode *)node);
        break;
      case 1:
switchD_00fc5bbf_caseD_1:
        KeyMapBase<unsigned_int>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_int> *)this,(KeyNode *)node);
        break;
      case 2:
switchD_00fc5bbf_caseD_2:
        KeyMapBase<unsigned_long>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_long> *)this,(KeyNode *)node);
        break;
      default:
        goto switchD_00fc5bbf_caseD_3;
      case 5:
switchD_00fc5bbf_caseD_5:
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,(KeyNode *)node);
        break;
      case 6:
switchD_00fc5bbf_caseD_6:
        switch(uVar9) {
        case 0:
          goto switchD_00fc5bbf_caseD_0;
        case 1:
          goto switchD_00fc5bbf_caseD_1;
        case 2:
          goto switchD_00fc5bbf_caseD_2;
        default:
          goto switchD_00fc5bbf_caseD_3;
        case 5:
          goto switchD_00fc5bbf_caseD_5;
        case 6:
          goto switchD_00fc5bbf_caseD_6;
        case 7:
          goto switchD_00fc5bbf_caseD_7;
        case 8:
          goto switchD_00fc5bbf_caseD_8;
        case 9:
          goto switchD_00fc5bbf_caseD_9;
        case 10:
          goto switchD_00fc5bbf_caseD_a;
        case 0xb:
          goto switchD_00fc5bbf_caseD_b;
        case 0xc:
          goto switchD_00fc5bbf_caseD_c;
        case 0xd:
        case 0xe:
          goto switchD_00fc5bbf_caseD_d;
        case 0xf:
          goto switchD_00fc5bbf_caseD_f;
        }
      case 7:
switchD_00fc5bbf_caseD_7:
        pcVar16 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                            ((MessageLite *)ptr,(char *)ptr_00,(ParseContext *)pLVar21,
                             (TcFieldData)0x14339d4,(TcParseTableBase *)table_00,
                             (uint64_t)hasbits_00._M_head_impl);
        return pcVar16;
      case 8:
switchD_00fc5bbf_caseD_8:
        pcVar16 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                            ((MessageLite *)ptr,(char *)ptr_00,(ParseContext *)pLVar21,
                             (TcFieldData)0x14339d4,(TcParseTableBase *)table_00,
                             (uint64_t)hasbits_00._M_head_impl);
        return pcVar16;
      case 9:
switchD_00fc5bbf_caseD_9:
        pcVar16 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                            ((MessageLite *)ptr,(char *)ptr_00,(ParseContext *)pLVar21,
                             (TcFieldData)0x14339d4,(TcParseTableBase *)table_00,
                             (uint64_t)hasbits_00._M_head_impl);
        return pcVar16;
      case 10:
switchD_00fc5bbf_caseD_a:
      case 0xb:
switchD_00fc5bbf_caseD_b:
        uVar15 = (ulong)(*(byte *)((long)&(((LogMessageData *)ptr)->entry).full_filename_._M_str + 7
                                  ) & 0xf);
      case 0xf:
switchD_00fc5bbf_caseD_f:
        if (5 < (uint)uVar15) {
          UntypedMapBase::
          VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                    ();
        }
        puVar13 = &switchD_00fca0b6::switchdataD_014339fc;
code_r0x00fca0af:
        pcVar16 = (char *)(*(code *)((long)(int)puVar13[uVar15] + (long)puVar13))();
        return pcVar16;
      case 0xc:
switchD_00fc5bbf_caseD_c:
        if (SCARRY8(uVar14,0x14339d4) != (long)uVar15 < 0) {
          return (char *)pLVar26;
        }
        pcVar16 = (char *)((long)&UINT_01433960 + uVar14 + 1);
        *pcVar16 = *pcVar16 + -0x2c + (0xfffffffffebcc62b < uVar14);
        uVar15 = (ulong)((uint)uVar15 | 0x46994d);
        goto code_r0x00fca0af;
      case 0xd:
      case 0xe:
switchD_00fc5bbf_caseD_d:
        pcVar16 = (char *)((long)&UINT_01433a34 + uVar14 + 3);
        *pcVar16 = *pcVar16 + (char)HVar23.lo_;
        uVar15 = CONCAT71((int7)(uVar15 >> 8),(char)uVar15 + -0x7f);
        goto code_r0x00fca0af;
      }
    }
    else {
      puVar13 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)this,(NodeBase *)node);
      uVar9 = *puVar13;
      puVar13 = *(uint **)(local_88.data + 8);
      ptr_00 = (LogMessageData *)(long)(short)*puVar13;
      ptr = (char *)(ulong)(*puVar13 >> 0x10);
      pLVar21 = (LogMessageData *)(((long)(int)uVar9 - (long)ptr_00) - (long)ptr);
      if ((LogMessageData *)((long)(int)uVar9 - (long)ptr_00) < ptr) goto LAB_00fc5b99;
      uVar6 = puVar13[1];
      ptr_00 = (LogMessageData *)(ulong)uVar6;
      ptr = (char *)(ulong)(ushort)uVar6;
      if (ptr <= pLVar21) {
        pLVar21 = (LogMessageData *)(ulong)(uVar6 >> 0x10);
        pLVar22 = (LogMessageData *)0x0;
        do {
          ptr_00 = pLVar22;
          ptr = (char *)CONCAT71((int7)((ulong)ptr >> 8),ptr_00 < pLVar21);
          if (ptr_00 >= pLVar21) goto LAB_00fc5c69;
          uVar7 = *(uint *)((long)puVar13 + (long)ptr_00 * 4 + (ulong)(uVar6 >> 3 & 0x1ffc) + 8);
          ptr = (char *)(ulong)uVar7;
          HVar23._1_7_ = 0;
          HVar23.lo_._0_1_ = (int)uVar9 < (int)uVar7;
          table_00 = (LogMessageData *)(((long)ptr_00 * 2 - (long)HVar23) + 2);
          pLVar22 = table_00;
        } while (uVar7 != uVar9);
        goto LAB_00fc5b99;
      }
      ptr = (char *)(ulong)CONCAT11((char)(uVar6 >> 8),
                                    (puVar13[((ulong)pLVar21 >> 5) + 2] >> ((uint)pLVar21 & 0x1f) &
                                    1) != 0);
LAB_00fc5c69:
      if ((char)ptr != '\0') goto LAB_00fc5b99;
      HVar23 = local_58;
      WriteMapEntryAsUnknown
                (msg,table,(UntypedMapBase *)this,uVar10,(NodeBase *)node,local_58._0_5_);
      table_00 = node;
    }
    puVar8 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (puVar8 <= puVar12) {
      uVar4 = table->has_bits_offset;
      goto joined_r0x00fc5e15;
    }
    bVar2 = (byte)*puVar12;
    uVar9 = (uint)bVar2;
    ptr = (char *)((long)puVar12 + 1);
    if ((char)bVar2 < '\0') {
      uVar19 = (uint7)(((ulong)bVar2 << 0x39) >> 8);
      cVar3 = *(char *)&(((LogMessageData *)ptr)->entry).full_filename_._M_len;
      lVar18 = CONCAT71(uVar19,cVar3);
      if (cVar3 < '\0') {
        uVar19 = uVar19 >> 7 | (uint7)((ulong)(lVar18 << 0x39) >> 8);
        lVar18 = CONCAT71(uVar19,(byte)puVar12[1]);
        if ((char)(byte)puVar12[1] < '\0') {
          uVar19 = uVar19 >> 7 | (uint7)((ulong)(lVar18 << 0x39) >> 8);
          lVar18 = CONCAT71(uVar19,*(byte *)((long)puVar12 + 3));
          if ((char)*(byte *)((long)puVar12 + 3) < '\0') {
            uVar19 = uVar19 >> 7 | (uint7)((ulong)(lVar18 << 0x39) >> 8);
            if ((char)(byte)puVar12[2] < '\0') {
              uVar9 = 0;
              ptr = (char *)0x0;
            }
            else {
              uVar9 = (int)CONCAT71(uVar19,(byte)puVar12[2]) << 0x1c | (uint)(uVar19 >> 0x1c);
              ptr = (char *)((long)puVar12 + 5);
            }
          }
          else {
            uVar9 = (int)lVar18 << 0x15 | (uint)(uVar19 >> 0x23);
            ptr = (char *)(puVar12 + 2);
          }
        }
        else {
          uVar9 = (int)lVar18 << 0xe | (uint)(uVar19 >> 0x2a);
          ptr = (char *)((long)puVar12 + 3);
        }
      }
      else {
        uVar9 = (int)lVar18 << 7 | (uint)(((ulong)bVar2 << 0x39) >> 0x39);
        ptr = (char *)(puVar12 + 1);
      }
    }
    if (uVar9 != uVar10) {
      if (puVar12 < puVar8) {
        uVar10 = (uint)table->fast_idx_mask & (uint)*puVar12;
        if ((uVar10 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar14 = (ulong)(uVar10 & 0xfffffff8);
        pcVar16 = (char *)(**(code **)(&table[1].has_bits_offset + uVar14))
                                    (msg,puVar12,ctx,
                                     (ulong)*puVar12 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2),table,hasbits)
        ;
        return pcVar16;
      }
      uVar4 = table->has_bits_offset;
joined_r0x00fc5e15:
      if ((ulong)uVar4 != 0) {
        puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar4);
        if (((ulong)puVar13 & 3) != 0) {
          AlignFail();
        }
        *puVar13 = *puVar13 | (uint)hasbits;
      }
      return (char *)puVar12;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}